

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.c
# Opt level: O1

void coda_za_close(za_file *zf)

{
  void *__ptr;
  long lVar1;
  long lVar2;
  
  close(zf->fd);
  if (zf->entry != (za_entry *)0x0) {
    if (0 < zf->num_entries) {
      lVar1 = 0x28;
      lVar2 = 0;
      do {
        __ptr = *(void **)((long)&zf->entry->localheader_offset + lVar1);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x38;
      } while (lVar2 < zf->num_entries);
    }
    free(zf->entry);
  }
  if (zf->filename != (char *)0x0) {
    free(zf->filename);
  }
  if (zf->hash_data != (hashtable *)0x0) {
    coda_hashtable_delete(zf->hash_data);
  }
  free(zf);
  return;
}

Assistant:

void za_close(za_file *zf)
{
    close(zf->fd);
    if (zf->entry != NULL)
    {
        int i;

        for (i = 0; i < zf->num_entries; i++)
        {
            if (zf->entry[i].filename != NULL)
            {
                free(zf->entry[i].filename);
            }
        }
        free(zf->entry);
    }
    if (zf->filename != NULL)
    {
        free(zf->filename);
    }
    if (zf->hash_data != NULL)
    {
        hashtable_delete(zf->hash_data);
    }
    free(zf);
}